

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

int Ivy_NodeCompareSims(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj0,Ivy_Obj_t *pObj1)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)p->nSimWords;
  if (p->nSimWords < 1) {
    uVar3 = uVar4;
  }
  do {
    if (uVar3 == uVar4) {
      return 1;
    }
    lVar1 = uVar4 * 4;
    lVar2 = uVar4 * 4;
    uVar4 = uVar4 + 1;
  } while (*(int *)((long)&pObj0->pFanout->pFanout + lVar1) ==
           *(int *)((long)&pObj1->pFanout->pFanout + lVar2));
  return 0;
}

Assistant:

int Ivy_NodeCompareSims( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj0, Ivy_Obj_t * pObj1 )
{
    Ivy_FraigSim_t * pSims0, * pSims1;
    int i;
    pSims0 = Ivy_ObjSim(pObj0);
    pSims1 = Ivy_ObjSim(pObj1);
    for ( i = 0; i < p->nSimWords; i++ )
        if ( pSims0->pData[i] != pSims1->pData[i] )
            return 0;
    return 1;
}